

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_request.c
# Opt level: O2

ngx_int_t ngx_http_process_request_uri(ngx_http_request_t *r)

{
  ngx_log_t *pnVar1;
  u_char *puVar2;
  u_char *puVar3;
  ngx_int_t nVar4;
  ulong uVar5;
  u_char *puVar6;
  u_char *puVar7;
  
  puVar3 = r->args_start;
  if (puVar3 == (u_char *)0x0) {
    puVar7 = r->uri_end;
  }
  else {
    puVar7 = puVar3 + -1;
  }
  uVar5 = *(ulong *)&r->field_0x460;
  puVar6 = r->uri_start;
  (r->uri).len = (long)puVar7 - (long)puVar6;
  if ((uVar5 & 0x6000000000) == 0) {
    (r->uri).data = puVar6;
LAB_0013ddb7:
    puVar7 = r->uri_end;
    puVar2 = r->uri_ext;
    (r->unparsed_uri).len = (long)puVar7 - (long)puVar6;
    (r->unparsed_uri).data = puVar6;
    *(ulong *)&r->field_0x460 =
         (uVar5 & 0xffffefffffffffff | (uVar5 & 0x10000000000) << 4) ^ 0x100000000000;
    if (puVar2 != (u_char *)0x0) {
      puVar6 = puVar3 + -1;
      if (puVar3 == (u_char *)0x0) {
        puVar6 = puVar7;
      }
      (r->exten).len = (long)puVar6 - (long)puVar2;
      (r->exten).data = puVar2;
    }
    if ((puVar3 <= puVar7 && (long)puVar7 - (long)puVar3 != 0) && puVar3 != (u_char *)0x0) {
      (r->args).len = (long)puVar7 - (long)puVar3;
      (r->args).data = puVar3;
    }
    pnVar1 = r->connection->log;
    if ((pnVar1->log_level & 0x100) == 0) {
      nVar4 = 0;
    }
    else {
      nVar4 = 0;
      ngx_log_error_core(8,pnVar1,0,"http uri: \"%V\"",&r->uri);
      pnVar1 = r->connection->log;
      if ((pnVar1->log_level & 0x100) != 0) {
        nVar4 = 0;
        ngx_log_error_core(8,pnVar1,0,"http args: \"%V\"",&r->args);
        pnVar1 = r->connection->log;
        if ((pnVar1->log_level & 0x100) != 0) {
          nVar4 = 0;
          ngx_log_error_core(8,pnVar1,0,"http exten: \"%V\"",&r->exten);
        }
      }
    }
  }
  else {
    puVar3 = (u_char *)ngx_pnalloc(r->pool,((long)puVar7 - (long)puVar6) + 1);
    (r->uri).data = puVar3;
    if (puVar3 == (u_char *)0x0) {
      ngx_http_close_request(r,500);
    }
    else {
      nVar4 = ngx_http_parse_complex_uri
                        (r,*(ngx_uint_t *)((long)r->srv_conf[ngx_http_core_module.ctx_index] + 0x78)
                        );
      if (nVar4 == 0) {
        uVar5 = *(ulong *)&r->field_0x460;
        puVar6 = r->uri_start;
        puVar3 = r->args_start;
        goto LAB_0013ddb7;
      }
      (r->uri).len = 0;
      pnVar1 = r->connection->log;
      if (6 < pnVar1->log_level) {
        ngx_log_error_core(7,pnVar1,0,"client sent invalid request");
      }
      ngx_http_finalize_request(r,400);
    }
    nVar4 = -1;
  }
  return nVar4;
}

Assistant:

ngx_int_t
ngx_http_process_request_uri(ngx_http_request_t *r)
{
    ngx_http_core_srv_conf_t  *cscf;

    if (r->args_start) {
        r->uri.len = r->args_start - 1 - r->uri_start;
    } else {
        r->uri.len = r->uri_end - r->uri_start;
    }

    if (r->complex_uri || r->quoted_uri) {

        r->uri.data = ngx_pnalloc(r->pool, r->uri.len + 1);
        if (r->uri.data == NULL) {
            ngx_http_close_request(r, NGX_HTTP_INTERNAL_SERVER_ERROR);
            return NGX_ERROR;
        }

        cscf = ngx_http_get_module_srv_conf(r, ngx_http_core_module);

        if (ngx_http_parse_complex_uri(r, cscf->merge_slashes) != NGX_OK) {
            r->uri.len = 0;

            ngx_log_error(NGX_LOG_INFO, r->connection->log, 0,
                          "client sent invalid request");
            ngx_http_finalize_request(r, NGX_HTTP_BAD_REQUEST);
            return NGX_ERROR;
        }

    } else {
        r->uri.data = r->uri_start;
    }

    r->unparsed_uri.len = r->uri_end - r->uri_start;
    r->unparsed_uri.data = r->uri_start;

    r->valid_unparsed_uri = r->space_in_uri ? 0 : 1;

    if (r->uri_ext) {
        if (r->args_start) {
            r->exten.len = r->args_start - 1 - r->uri_ext;
        } else {
            r->exten.len = r->uri_end - r->uri_ext;
        }

        r->exten.data = r->uri_ext;
    }

    if (r->args_start && r->uri_end > r->args_start) {
        r->args.len = r->uri_end - r->args_start;
        r->args.data = r->args_start;
    }

#if (NGX_WIN32)
    {
    u_char  *p, *last;

    p = r->uri.data;
    last = r->uri.data + r->uri.len;

    while (p < last) {

        if (*p++ == ':') {

            /*
             * this check covers "::$data", "::$index_allocation" and
             * ":$i30:$index_allocation"
             */

            if (p < last && *p == '$') {
                ngx_log_error(NGX_LOG_INFO, r->connection->log, 0,
                              "client sent unsafe win32 URI");
                ngx_http_finalize_request(r, NGX_HTTP_BAD_REQUEST);
                return NGX_ERROR;
            }
        }
    }

    p = r->uri.data + r->uri.len - 1;

    while (p > r->uri.data) {

        if (*p == ' ') {
            p--;
            continue;
        }

        if (*p == '.') {
            p--;
            continue;
        }

        break;
    }

    if (p != r->uri.data + r->uri.len - 1) {
        r->uri.len = p + 1 - r->uri.data;
        ngx_http_set_exten(r);
    }

    }
#endif

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "http uri: \"%V\"", &r->uri);

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "http args: \"%V\"", &r->args);

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "http exten: \"%V\"", &r->exten);

    return NGX_OK;
}